

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O3

ChMatrix33<double> *
chrono::fea::rotutils::Rot(ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ActualDstType actualDst;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double coeff [2];
  double local_28;
  double local_20;
  
  RotCo<chrono::ChVector<double>,double>(2,phi,phi,&local_28);
  dVar1 = phi->m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1;
  auVar3 = *(undefined1 (*) [16])phi->m_data;
  dVar2 = phi->m_data[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  dVar4 = dVar1 * local_20;
  dVar18 = auVar3._0_8_;
  dVar5 = dVar18 * local_20;
  local_20 = dVar2 * local_20;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2 * local_28;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_28 * dVar1;
  auVar12 = vunpcklpd_avx(auVar7,auVar12);
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar7,auVar6);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4 * dVar1;
  auVar6 = vfnmsub231sd_fma(auVar17,auVar20,auVar10);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2 * dVar5;
  auVar6 = vunpcklpd_avx(auVar6,auVar23);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_28 * dVar18;
  auVar7 = vunpcklpd_avx(auVar7,auVar19);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 * dVar18;
  auVar10 = vfnmsub231sd_fma(auVar24,auVar8,auVar14);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * local_20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  auVar11 = vfnmsub231sd_fma(auVar11,auVar3,auVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar5 * dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar18 * local_20;
  auVar8 = vunpcklpd_avx(auVar15,auVar22);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1 * local_20;
  auVar10 = vunpcklpd_avx(auVar10,auVar9);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = 0.0 - local_28 * dVar1;
  auVar9 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar13);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar9._0_8_ + auVar6._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar9._8_8_ + auVar6._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar12._0_8_ + 0.0 + auVar8._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar12._8_8_ + 0.0 + auVar8._8_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = 0.0 - local_28 * dVar18;
  auVar12 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar16);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar12._0_8_ + auVar10._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar12._8_8_ + auVar10._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar4 * dVar18 + auVar7._0_8_ + 0.0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar4 * auVar3._8_8_ + auVar7._8_8_ + 0.0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar11._0_8_ + 1.0;
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Rot(const ChVector<>& phi) {
    double coeff[COEFF_B];

    CoeffB(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    ChStarMatrix33<> Phix(phi * coeff[0]);
    ChStarMatrix33<> pxpx(phi, phi * coeff[1]);

    return Eye + Phix + pxpx; // I + c[0] * phi x + c[1] * phi x phi x
}